

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_addmul_v_s256_129(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  int iVar1;
  block_t *Ablock;
  mzd_local_t *pmVar2;
  word *vptr;
  long lVar3;
  bool bVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  
  auVar5 = vpbroadcastq_avx512vl();
  auVar5 = vpternlogq_avx512vl(auVar5,*(undefined1 (*) [32])c->w64,*(undefined1 (*) [32])A[0x3f].w64
                               ,0x6c);
  auVar8 = ZEXT3264(auVar5);
  iVar1 = 2;
  auVar9 = ZEXT1664((undefined1  [16])0x0);
  while (pmVar2 = A, bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
    lVar3 = 0x800;
    while (A = pmVar2 + 0x40, (int)lVar3 != 0x1000) {
      auVar5 = vpbroadcastq_avx512vl();
      auVar6 = vpbroadcastq_avx512vl();
      auVar5 = vpand_avx2(auVar5,*(undefined1 (*) [32])((long)pmVar2->w64 + lVar3));
      auVar6 = vpand_avx2(auVar6,*(undefined1 (*) [32])((long)pmVar2[2].w64 + lVar3));
      auVar7 = vpbroadcastq_avx512vl();
      auVar7 = vpand_avx2(auVar7,*(undefined1 (*) [32])((long)pmVar2[1].w64 + lVar3));
      auVar5 = vpternlogq_avx512vl(auVar8._0_32_,auVar5,auVar6,0x96);
      auVar8 = ZEXT3264(auVar5);
      auVar5 = vpbroadcastq_avx512vl();
      auVar5 = vpand_avx2(auVar5,*(undefined1 (*) [32])((long)pmVar2[3].w64 + lVar3));
      lVar3 = lVar3 + 0x80;
      auVar5 = vpternlogq_avx512vl(auVar9._0_32_,auVar7,auVar5,0x96);
      auVar9 = ZEXT3264(auVar5);
    }
  }
  *(undefined1 (*) [32])c->w64 = auVar8._0_32_ ^ auVar9._0_32_;
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_addmul_v_s256_129(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word256 cval[2] = {mm256_load(cblock->w64), mm256_zero};
  {
    cval[0] =
        mm256_xor_mask(cval[0], mm256_load(Ablock[63].w64), mm256_compute_mask((*vptr) >> 63, 0));
    vptr++;
    Ablock += 64;
  }
  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 4, idx >>= 4, Ablock += 4) {
      cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask(idx, 0));
      cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[1].w64), mm256_compute_mask(idx, 1));
      cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[2].w64), mm256_compute_mask(idx, 2));
      cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[3].w64), mm256_compute_mask(idx, 3));
    }
  }
  mm256_store(cblock->w64, mm256_xor(cval[0], cval[1]));
}